

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertWeakNode
          (CollationBuilder *this,int32_t index,uint32_t weight16,int32_t level,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t nextWeight16;
  int32_t nextStrength;
  int32_t nextIndex;
  int32_t nextIndex_1;
  int64_t commonNode;
  ulong uStack_38;
  int32_t hasThisLevelBefore;
  int64_t node;
  UErrorCode *errorCode_local;
  int32_t level_local;
  uint32_t weight16_local;
  int32_t index_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (weight16 == 0x500) {
      this_local._4_4_ = findCommonNode(this,index,level);
    }
    else {
      uStack_38 = UVector64::elementAti(&this->nodes,index);
      iVar3 = index;
      if ((weight16 != 0) && (iVar3 = index, weight16 < 0x500)) {
        iVar2 = 0x20;
        if (level == 1) {
          iVar2 = 0x40;
        }
        iVar3 = index;
        if ((uStack_38 & (long)iVar2) == 0) {
          _nextIndex = nodeFromWeight16(0x500);
          uVar6 = nodeFromStrength(level);
          _nextIndex = _nextIndex | uVar6;
          if (level == 1) {
            _nextIndex = uStack_38 & 0x20 | _nextIndex;
            uStack_38 = uStack_38 & 0xffffffffffffffdf;
          }
          UVector64::setElementAt(&this->nodes,uStack_38 | (long)iVar2,index);
          iVar3 = nextIndexFromNode(uStack_38);
          uVar6 = nodeFromWeight16(weight16);
          uVar7 = nodeFromStrength(level);
          iVar4 = insertNodeBetween(this,index,iVar3,uVar6 | uVar7,errorCode);
          insertNodeBetween(this,iVar4,iVar3,_nextIndex,errorCode);
          return iVar4;
        }
      }
      do {
        do {
          do {
            level_local = iVar3;
            iVar3 = nextIndexFromNode(uStack_38);
            if (iVar3 == 0) goto LAB_0028af4f;
            uStack_38 = UVector64::elementAti(&this->nodes,iVar3);
            iVar4 = strengthFromNode(uStack_38);
          } while (level < iVar4);
          if (iVar4 < level) goto LAB_0028af4f;
          UVar1 = isTailoredNode(uStack_38);
        } while (UVar1 != '\0');
        uVar5 = weight16FromNode(uStack_38);
        if (uVar5 == weight16) {
          return iVar3;
        }
      } while (uVar5 <= weight16);
LAB_0028af4f:
      uVar6 = nodeFromWeight16(weight16);
      uVar7 = nodeFromStrength(level);
      this_local._4_4_ = insertNodeBetween(this,level_local,iVar3,uVar6 | uVar7,errorCode);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::findOrInsertWeakNode(int32_t index, uint32_t weight16, int32_t level, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(0 <= index && index < nodes.size());
    U_ASSERT(UCOL_SECONDARY <= level && level <= UCOL_TERTIARY);

    if(weight16 == Collation::COMMON_WEIGHT16) {
        return findCommonNode(index, level);
    }

    // If this will be the first below-common weight for the parent node,
    // then we will also need to insert a common weight after it.
    int64_t node = nodes.elementAti(index);
    U_ASSERT(strengthFromNode(node) < level);  // parent node is stronger
    if(weight16 != 0 && weight16 < Collation::COMMON_WEIGHT16) {
        int32_t hasThisLevelBefore = level == UCOL_SECONDARY ? HAS_BEFORE2 : HAS_BEFORE3;
        if((node & hasThisLevelBefore) == 0) {
            // The parent node has an implied level-common weight.
            int64_t commonNode =
                nodeFromWeight16(Collation::COMMON_WEIGHT16) | nodeFromStrength(level);
            if(level == UCOL_SECONDARY) {
                // Move the HAS_BEFORE3 flag from the parent node
                // to the new secondary common node.
                commonNode |= node & HAS_BEFORE3;
                node &= ~(int64_t)HAS_BEFORE3;
            }
            nodes.setElementAt(node | hasThisLevelBefore, index);
            // Insert below-common-weight node.
            int32_t nextIndex = nextIndexFromNode(node);
            node = nodeFromWeight16(weight16) | nodeFromStrength(level);
            index = insertNodeBetween(index, nextIndex, node, errorCode);
            // Insert common-weight node.
            insertNodeBetween(index, nextIndex, commonNode, errorCode);
            // Return index of below-common-weight node.
            return index;
        }
    }

    // Find the root CE's weight for this level.
    // Postpone insertion if not found:
    // Insert the new root node before the next stronger node,
    // or before the next root node with the same strength and a larger weight.
    int32_t nextIndex;
    while((nextIndex = nextIndexFromNode(node)) != 0) {
        node = nodes.elementAti(nextIndex);
        int32_t nextStrength = strengthFromNode(node);
        if(nextStrength <= level) {
            // Insert before a stronger node.
            if(nextStrength < level) { break; }
            // nextStrength == level
            if(!isTailoredNode(node)) {
                uint32_t nextWeight16 = weight16FromNode(node);
                if(nextWeight16 == weight16) {
                    // Found the node for the root CE up to this level.
                    return nextIndex;
                }
                // Insert before a node with a larger same-strength weight.
                if(nextWeight16 > weight16) { break; }
            }
        }
        // Skip the next node.
        index = nextIndex;
    }
    node = nodeFromWeight16(weight16) | nodeFromStrength(level);
    return insertNodeBetween(index, nextIndex, node, errorCode);
}